

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O3

void __thiscall icu_63::LocaleKey::~LocaleKey(LocaleKey *this)

{
  (this->super_ICUServiceKey).super_UObject._vptr_UObject = (_func_int **)&PTR__LocaleKey_002556e0;
  UnicodeString::~UnicodeString(&this->_currentID);
  UnicodeString::~UnicodeString(&this->_fallbackID);
  UnicodeString::~UnicodeString(&this->_primaryID);
  ICUServiceKey::~ICUServiceKey(&this->super_ICUServiceKey);
  return;
}

Assistant:

UnicodeString&
LocaleKey::prefix(UnicodeString& result) const {
    if (_kind != KIND_ANY) {
        UChar buffer[64];
        uprv_itou(buffer, 64, _kind, 10, 0);
        UnicodeString temp(buffer);
        result.append(temp);
    }
    return result;
}